

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImVec2 IVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  ImRect r_rel;
  
  IVar1 = (this->DC).CursorStartPos;
  fVar4 = IVar1.x;
  fVar5 = IVar1.y;
  r_rel.Min.x = (r_abs->Min).x - fVar4;
  r_rel.Min.y = (r_abs->Min).y - fVar5;
  r_rel.Max.x = (r_abs->Max).x - fVar4;
  r_rel.Max.y = (r_abs->Max).y - fVar5;
  uVar2 = ~(this->IDStack).Data[(long)(this->IDStack).Size + -1];
  lVar3 = 0;
  do {
    uVar2 = uVar2 >> 8 ^
            GCrc32LookupTable[(uint)*(byte *)((long)&r_rel.Min.x + lVar3) ^ uVar2 & 0xff];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return ~uVar2;
}

Assistant:

inline T&           back()                              { IM_ASSERT(Size > 0); return Data[Size - 1]; }